

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

ColumnRef __thiscall clickhouse::ColumnUUID::Slice(ColumnUUID *this,size_t begin,size_t len)

{
  element_type *peVar1;
  long in_RCX;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ColumnRef CVar2;
  element_type *this_00;
  undefined1 local_40 [8];
  shared_ptr<clickhouse::Column> *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  peVar1 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23bed2);
  (*(peVar1->super_Column)._vptr_Column[7])(local_40,peVar1,in_RDX * 2,in_RCX * 2);
  std::make_shared<clickhouse::ColumnUUID,std::shared_ptr<clickhouse::Column>>
            (in_stack_ffffffffffffffc8);
  std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnUUID,void>
            ((shared_ptr<clickhouse::Column> *)this_00,(shared_ptr<clickhouse::ColumnUUID> *)in_RDI)
  ;
  std::shared_ptr<clickhouse::ColumnUUID>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnUUID> *)0x23bf21);
  std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x23bf2b);
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (ColumnRef)CVar2.super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ColumnRef ColumnUUID::Slice(size_t begin, size_t len) {
    return std::make_shared<ColumnUUID>(data_->Slice(begin * 2, len * 2));
}